

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O1

bool icu_63::number::impl::AffixUtils::hasCurrencySymbols
               (UnicodeString *affixPattern,UErrorCode *status)

{
  short sVar1;
  AffixPatternType type;
  bool bVar2;
  int iVar3;
  Field FVar4;
  UErrorCode *in_R8;
  AffixTag AVar5;
  AffixTag AVar6;
  AffixTag local_40;
  
  AVar6 = local_40;
  sVar1 = (affixPattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (affixPattern->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 != 0) {
    local_40._0_8_ = local_40._4_8_ << 0x20;
    local_40.type = AVar6.type;
    local_40.state = STATE_BASE;
    bVar2 = hasNext(&local_40,affixPattern);
    if (bVar2) {
      AVar6 = local_40;
      do {
        AVar5._8_8_ = affixPattern;
        AVar5.offset = (int)AVar6._8_8_;
        AVar5.codePoint = (int)((ulong)AVar6._8_8_ >> 0x20);
        AVar6 = nextToken(AVar6._0_8_,AVar5,(UnicodeString *)status,in_R8);
        if (U_ZERO_ERROR < *status) {
          return false;
        }
        local_40.type = AVar6.type;
        AVar5 = AVar6;
        if ((local_40.type < TYPE_CODEPOINT) &&
           (type = local_40.type, local_40 = AVar6, FVar4 = getFieldForType(type), AVar5 = local_40,
           FVar4 == UNUM_CURRENCY_FIELD)) {
          return true;
        }
        local_40 = AVar5;
        bVar2 = hasNext(&local_40,affixPattern);
      } while (bVar2);
    }
  }
  return false;
}

Assistant:

bool AffixUtils::hasCurrencySymbols(const UnicodeString &affixPattern, UErrorCode &status) {
    if (affixPattern.length() == 0) {
        return false;
    }
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return false; }
        if (tag.type < 0 && getFieldForType(tag.type) == UNUM_CURRENCY_FIELD) {
            return true;
        }
    }
    return false;
}